

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSymStr.c
# Opt level: O1

int Sim_SymmsIsCompatibleWithNodes(Abc_Ntk_t *pNtk,uint uSymm,Vec_Ptr_t *vNodesOther,int *pMap)

{
  void *pvVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  
  if ((long)vNodesOther->nSize < 1) {
    return 1;
  }
  lVar4 = 0;
  do {
    uVar3 = (ulong)vNodesOther->pArray[lVar4] & 0xfffffffffffffffe;
    pvVar1 = pNtk->vSupps->pArray[*(int *)(uVar3 + 0x10)];
    uVar5 = *(uint *)((long)pvVar1 + (ulong)(uSymm >> 5 & 0x7ff) * 4) & 1 << ((byte)uSymm & 0x1f);
    uVar6 = *(uint *)((long)pvVar1 + (ulong)(uSymm >> 0x15) * 4) &
            1 << ((byte)(uSymm >> 0x10) & 0x1f);
    if (uVar5 != 0 || uVar6 != 0) {
      if ((uVar5 != 0) != (uVar6 != 0)) {
        return 0;
      }
      lVar2 = *(long *)(uVar3 + 0x40);
      uVar5 = *(uint *)(lVar2 + 4);
      uVar3 = 0;
      if (0 < (int)uVar5) {
        uVar3 = 0;
        do {
          if (*(uint *)(*(long *)(lVar2 + 8) + uVar3 * 4) == uSymm) goto LAB_004c9b57;
          uVar3 = uVar3 + 1;
        } while (uVar5 != uVar3);
        uVar3 = (ulong)uVar5;
      }
LAB_004c9b57:
      if ((uint)uVar3 == uVar5) {
        return 0;
      }
    }
    lVar4 = lVar4 + 1;
    if (lVar4 == vNodesOther->nSize) {
      return 1;
    }
  } while( true );
}

Assistant:

int Sim_SymmsIsCompatibleWithNodes( Abc_Ntk_t * pNtk, unsigned uSymm, Vec_Ptr_t * vNodesOther, int * pMap )
{
    Vec_Int_t * vSymmsNode;
    Abc_Obj_t * pNode;
    int i, s, Ind1, Ind2, fIsVar1, fIsVar2;

    if ( vNodesOther->nSize == 0 )
        return 1;

    // get the indices of the PI variables
    Ind1 = (uSymm & 0xffff);
    Ind2 = (uSymm >> 16);

    // go through the nodes
    // if they do not belong to a support, it is okay
    // if one belongs, the other does not belong, quit
    // if they belong, but are not part of symmetry, quit
    for ( i = 0; i < vNodesOther->nSize; i++ )
    {
        pNode = Abc_ObjRegular((Abc_Obj_t *)vNodesOther->pArray[i]);
        fIsVar1 = Sim_SuppStrHasVar( pNtk->vSupps, pNode, Ind1 );
        fIsVar2 = Sim_SuppStrHasVar( pNtk->vSupps, pNode, Ind2 );

        if ( !fIsVar1 && !fIsVar2 )
            continue;
        if ( fIsVar1 ^ fIsVar2 )
            return 0;
        // both belong
        // check if there is a symmetry
        vSymmsNode = SIM_READ_SYMMS( pNode );
        for ( s = 0; s < vSymmsNode->nSize; s++ )
            if ( uSymm == (unsigned)vSymmsNode->pArray[s] )
                break;
        if ( s == vSymmsNode->nSize )
            return 0;
    }
    return 1;
}